

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

bool __thiscall llvm::detail::DoubleAPFloat::getExactInverse(DoubleAPFloat *this,APFloat *inv)

{
  undefined1 local_b0 [55];
  byte local_79;
  undefined1 local_78 [7];
  bool Ret;
  APFloat Inv;
  DoubleAPFloat local_50;
  undefined1 local_40 [8];
  APFloat Tmp;
  APFloat *inv_local;
  DoubleAPFloat *this_local;
  
  Tmp.U._16_8_ = inv;
  if (this->Semantics != (fltSemantics *)semPPCDoubleDouble) {
    __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x1123,"bool llvm::detail::DoubleAPFloat::getExactInverse(APFloat *) const");
  }
  bitcastToAPInt(&local_50);
  APFloat::APFloat((APFloat *)local_40,(fltSemantics *)semPPCDoubleDoubleLegacy,(APInt *)&local_50);
  APInt::~APInt((APInt *)&local_50);
  if (Tmp.U._16_8_ == 0) {
    this_local._7_1_ = APFloat::getExactInverse((APFloat *)local_40,(APFloat *)0x0);
    Inv.U._20_4_ = 1;
  }
  else {
    APFloat::APFloat((APFloat *)local_78,(fltSemantics *)semPPCDoubleDoubleLegacy);
    local_79 = APFloat::getExactInverse((APFloat *)local_40,(APFloat *)local_78);
    APFloat::bitcastToAPInt((APFloat *)local_b0);
    APFloat::APFloat((APFloat *)(local_b0 + 0x10),(fltSemantics *)semPPCDoubleDouble,
                     (APInt *)local_b0);
    APFloat::operator=((APFloat *)Tmp.U._16_8_,(APFloat *)(local_b0 + 0x10));
    APFloat::~APFloat((APFloat *)(local_b0 + 0x10));
    APInt::~APInt((APInt *)local_b0);
    this_local._7_1_ = (bool)(local_79 & 1);
    Inv.U._20_4_ = 1;
    APFloat::~APFloat((APFloat *)local_78);
  }
  APFloat::~APFloat((APFloat *)local_40);
  return this_local._7_1_;
}

Assistant:

bool DoubleAPFloat::getExactInverse(APFloat *inv) const {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  APFloat Tmp(semPPCDoubleDoubleLegacy, bitcastToAPInt());
  if (!inv)
    return Tmp.getExactInverse(nullptr);
  APFloat Inv(semPPCDoubleDoubleLegacy);
  auto Ret = Tmp.getExactInverse(&Inv);
  *inv = APFloat(semPPCDoubleDouble, Inv.bitcastToAPInt());
  return Ret;
}